

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRST.cxx
# Opt level: O3

void __thiscall cmRST::ProcessLine(cmRST *this,string *line)

{
  RegularExpression *pRVar1;
  ulong uVar2;
  char *pcVar3;
  pointer pcVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  string file;
  string local_88;
  string local_68;
  string local_48;
  
  bVar5 = this->LastLineEndedInColonColon;
  this->LastLineEndedInColonColon = false;
  iVar6 = std::__cxx11::string::compare((char *)line);
  if ((iVar6 == 0) ||
     ((((uVar2 = line->_M_string_length, 2 < uVar2 &&
        (pcVar3 = (line->_M_dataplus)._M_p, *pcVar3 == '.')) && (pcVar3[1] == '.')) &&
      (iVar6 = isspace((int)pcVar3[2]), iVar6 != 0)))) {
    Reset(this);
    lVar7 = std::__cxx11::string::find_first_not_of((char *)line,0x4dd330,2);
    this->Markup = (lVar7 == -1) + MarkupNormal;
    bVar5 = cmsys::RegularExpression::find
                      (&this->CMakeDirective,(line->_M_dataplus)._M_p,
                       &(this->CMakeDirective).regmatch);
    if (bVar5) {
LAB_001ea3e0:
      Reset(this);
      OutputLine(this,line,true);
      return;
    }
    bVar5 = cmsys::RegularExpression::find
                      (&this->CMakeModuleDirective,(line->_M_dataplus)._M_p,
                       &(this->CMakeModuleDirective).regmatch);
    if (bVar5) {
      pcVar3 = (this->CMakeModuleDirective).regmatch.startp[1];
      if (pcVar3 == (char *)0x0) {
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        local_88._M_string_length = 0;
        local_88.field_2._M_local_buf[0] = '\0';
      }
      else {
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_88,pcVar3,(this->CMakeModuleDirective).regmatch.endp[1]);
        if (local_88._M_string_length != 0) {
          local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_48,local_88._M_dataplus._M_p,
                     local_88._M_dataplus._M_p + local_88._M_string_length);
          bVar5 = ProcessInclude(this,&local_48,IncludeModule);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_48._M_dataplus._M_p != &local_48.field_2) {
            operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
          }
          if (bVar5) goto LAB_001ea65a;
        }
      }
      Reset(this);
      OutputLine(this,line,true);
    }
    else {
      bVar5 = cmsys::RegularExpression::find
                        (&this->ParsedLiteralDirective,(line->_M_dataplus)._M_p,
                         &(this->ParsedLiteralDirective).regmatch);
      if (bVar5) {
        this->Directive = DirectiveParsedLiteral;
        pcVar3 = (this->ParsedLiteralDirective).regmatch.startp[1];
        if (pcVar3 == (char *)0x0) {
          local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
          local_88._M_string_length = 0;
          local_88.field_2._M_local_buf[0] = '\0';
        }
        else {
          local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_88,pcVar3,(this->ParsedLiteralDirective).regmatch.endp[1]);
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &this->MarkupLines,&local_88);
      }
      else {
        bVar5 = cmsys::RegularExpression::find
                          (&this->CodeBlockDirective,(line->_M_dataplus)._M_p,
                           &(this->CodeBlockDirective).regmatch);
        if (bVar5) {
          this->Directive = DirectiveCodeBlock;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::emplace_back<>(&this->MarkupLines);
          return;
        }
        pRVar1 = &this->ReplaceDirective;
        bVar5 = cmsys::RegularExpression::find(pRVar1,(line->_M_dataplus)._M_p,&pRVar1->regmatch);
        if (bVar5) {
          this->Directive = DirectiveReplace;
          cmsys::RegularExpression::match_abi_cxx11_(&local_88,pRVar1,1);
          std::__cxx11::string::operator=((string *)&this->ReplaceName,(string *)&local_88);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p,
                            CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                                     local_88.field_2._M_local_buf[0]) + 1);
          }
          cmsys::RegularExpression::match_abi_cxx11_(&local_88,pRVar1,2);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &this->MarkupLines,&local_88);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p == &local_88.field_2) {
            return;
          }
          goto LAB_001ea668;
        }
        pRVar1 = &this->IncludeDirective;
        bVar5 = cmsys::RegularExpression::find(pRVar1,(line->_M_dataplus)._M_p,&pRVar1->regmatch);
        if (bVar5) {
          cmsys::RegularExpression::match_abi_cxx11_(&local_88,pRVar1,1);
          if (local_88._M_string_length != 0) {
            local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_68,local_88._M_dataplus._M_p,
                       local_88._M_dataplus._M_p + local_88._M_string_length);
            bVar5 = ProcessInclude(this,&local_68,IncludeNormal);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p != &local_68.field_2) {
              operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
            }
            if (bVar5) goto LAB_001ea65a;
          }
          Reset(this);
          OutputLine(this,line,true);
        }
        else {
          pRVar1 = &this->TocTreeDirective;
          bVar5 = cmsys::RegularExpression::find(pRVar1,(line->_M_dataplus)._M_p,&pRVar1->regmatch);
          if (!bVar5) {
            bVar5 = cmsys::RegularExpression::find
                              (&this->ProductionListDirective,(line->_M_dataplus)._M_p,
                               &(this->ProductionListDirective).regmatch);
            if ((!bVar5) &&
               (bVar5 = cmsys::RegularExpression::find
                                  (&this->NoteDirective,(line->_M_dataplus)._M_p,
                                   &(this->NoteDirective).regmatch), !bVar5)) {
              return;
            }
            goto LAB_001ea3e0;
          }
          this->Directive = DirectiveTocTree;
          cmsys::RegularExpression::match_abi_cxx11_(&local_88,pRVar1,1);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &this->MarkupLines,&local_88);
        }
      }
    }
LAB_001ea65a:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p == &local_88.field_2) {
      return;
    }
LAB_001ea668:
    operator_delete(local_88._M_dataplus._M_p,
                    CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                             local_88.field_2._M_local_buf[0]) + 1);
    return;
  }
  if (this->Markup == MarkupNone) {
    if ((uVar2 == 0) && (bVar5 != false)) {
      this->Markup = MarkupNormal;
      this->Directive = DirectiveLiteralBlock;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::emplace_back<>(&this->MarkupLines);
      local_88._M_string_length = 0;
      local_88.field_2._M_local_buf[0] = '\0';
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      OutputLine(this,&local_88,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p == &local_88.field_2) {
        return;
      }
      goto LAB_001ea668;
    }
LAB_001ea4b1:
    Reset(this);
    OutputLine(this,line,true);
    uVar2 = line->_M_string_length;
    if ((uVar2 < 2) || (pcVar4 = (line->_M_dataplus)._M_p, pcVar4[uVar2 - 2] != ':')) {
      bVar5 = false;
    }
    else {
      bVar5 = pcVar4[uVar2 - 1] == ':';
    }
    this->LastLineEndedInColonColon = bVar5;
  }
  else {
    if (this->Markup == MarkupEmpty) {
      if (uVar2 == 0) goto LAB_001ea3e0;
LAB_001ea469:
      iVar6 = isspace((int)*(line->_M_dataplus)._M_p);
      if (iVar6 == 0) goto LAB_001ea4b1;
    }
    else if (uVar2 != 0) goto LAB_001ea469;
    this->Markup = MarkupNormal;
    if ((this->MarkupLines).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (this->MarkupLines).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->MarkupLines,line);
      return;
    }
  }
  return;
}

Assistant:

void cmRST::ProcessLine(std::string const& line)
{
  bool lastLineEndedInColonColon = this->LastLineEndedInColonColon;
  this->LastLineEndedInColonColon = false;

  // A line starting in .. is an explicit markup start.
  if (line == ".." ||
      (line.size() >= 3 && line[0] == '.' && line[1] == '.' &&
       isspace(line[2]))) {
    this->Reset();
    this->Markup =
      (line.find_first_not_of(" \t", 2) == std::string::npos ? MarkupEmpty
                                                             : MarkupNormal);
    if (this->CMakeDirective.find(line)) {
      // Output cmake domain directives and their content normally.
      this->NormalLine(line);
    } else if (this->CMakeModuleDirective.find(line)) {
      // Process cmake-module directive: scan .cmake file comments.
      std::string file = this->CMakeModuleDirective.match(1);
      if (file.empty() || !this->ProcessInclude(file, IncludeModule)) {
        this->NormalLine(line);
      }
    } else if (this->ParsedLiteralDirective.find(line)) {
      // Record the literal lines to output after whole block.
      this->Directive = DirectiveParsedLiteral;
      this->MarkupLines.push_back(this->ParsedLiteralDirective.match(1));
    } else if (this->CodeBlockDirective.find(line)) {
      // Record the literal lines to output after whole block.
      // Ignore the language spec and record the opening line as blank.
      this->Directive = DirectiveCodeBlock;
      this->MarkupLines.emplace_back();
    } else if (this->ReplaceDirective.find(line)) {
      // Record the replace directive content.
      this->Directive = DirectiveReplace;
      this->ReplaceName = this->ReplaceDirective.match(1);
      this->MarkupLines.push_back(this->ReplaceDirective.match(2));
    } else if (this->IncludeDirective.find(line)) {
      // Process the include directive or output the directive and its
      // content normally if it fails.
      std::string file = this->IncludeDirective.match(1);
      if (file.empty() || !this->ProcessInclude(file, IncludeNormal)) {
        this->NormalLine(line);
      }
    } else if (this->TocTreeDirective.find(line)) {
      // Record the toctree entries to process after whole block.
      this->Directive = DirectiveTocTree;
      this->MarkupLines.push_back(this->TocTreeDirective.match(1));
    } else if (this->ProductionListDirective.find(line)) {
      // Output productionlist directives and their content normally.
      this->NormalLine(line);
    } else if (this->NoteDirective.find(line)) {
      // Output note directives and their content normally.
      this->NormalLine(line);
    }
  }
  // An explicit markup start followed nothing but whitespace and a
  // blank line does not consume any indented text following.
  else if (this->Markup == MarkupEmpty && line.empty()) {
    this->NormalLine(line);
  }
  // Indented lines following an explicit markup start are explicit markup.
  else if (this->Markup && (line.empty() || isspace(line[0]))) {
    this->Markup = MarkupNormal;
    // Record markup lines if the start line was recorded.
    if (!this->MarkupLines.empty()) {
      this->MarkupLines.push_back(line);
    }
  }
  // A blank line following a paragraph ending in "::" starts a literal block.
  else if (lastLineEndedInColonColon && line.empty()) {
    // Record the literal lines to output after whole block.
    this->Markup = MarkupNormal;
    this->Directive = DirectiveLiteralBlock;
    this->MarkupLines.emplace_back();
    this->OutputLine("", false);
  }
  // Print non-markup lines.
  else {
    this->NormalLine(line);
    this->LastLineEndedInColonColon =
      (line.size() >= 2 && line[line.size() - 2] == ':' && line.back() == ':');
  }
}